

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker stroker,PVG_FT_Outline *outline)

{
  PVG_FT_Bool PVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  PVG_FT_Error PVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  PVG_FT_Vector *pPVar9;
  PVG_FT_Vector *pPVar10;
  PVG_FT_Vector *pPVar11;
  PVG_FT_Vector *pPVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  PVG_FT_Vector vec;
  PVG_FT_Vector v_start;
  PVG_FT_Vector v_control;
  PVG_FT_Vector v_middle;
  PVG_FT_Vector vec_2;
  PVG_FT_Vector local_b8;
  PVG_FT_Vector local_a8;
  PVG_FT_Outline *local_90;
  PVG_FT_Vector local_88;
  PVG_FT_Vector local_78;
  PVG_FT_Vector *local_60;
  PVG_FT_Vector *local_58;
  ulong local_50;
  PVG_FT_Vector local_48;
  
  PVar5 = -1;
  if (stroker != (PVG_FT_Stroker)0x0 && outline != (PVG_FT_Outline *)0x0) {
    PVar5 = 0;
    stroker->borders[0].num_points = 0;
    stroker->borders[0].start = -1;
    stroker->borders[0].valid = '\0';
    stroker->borders[1].num_points = 0;
    stroker->borders[1].start = -1;
    stroker->borders[1].valid = '\0';
    if (0 < outline->n_contours) {
      local_58 = &stroker->center;
      local_60 = &stroker->subpath_start;
      lVar8 = 0;
      uVar6 = 0;
      local_90 = outline;
      do {
        uVar2 = outline->contours[lVar8];
        local_50 = (ulong)uVar2;
        if (uVar6 < uVar2) {
          pPVar11 = outline->points;
          pPVar10 = pPVar11 + local_50;
          lVar3 = pPVar11[uVar6].x;
          lVar4 = pPVar11[uVar6].y;
          local_a8.x = pPVar10->x;
          local_a8.y = pPVar10->y;
          local_88.x = pPVar11[uVar6].x;
          local_88.y = pPVar11[uVar6].y;
          pcVar14 = outline->tags;
          if ((pcVar14[uVar6] & 3U) == 2) {
            iVar7 = 5;
          }
          else {
            pPVar11 = pPVar11 + uVar6;
            pcVar13 = pcVar14 + uVar6;
            if ((pcVar14[uVar6] & 3U) == 0) {
              if ((pcVar14[local_50] & 3U) == 1) {
                pPVar10 = pPVar10 + -1;
              }
              else {
                local_a8.x = (local_a8.x + lVar3) / 2;
                local_a8.y = (local_a8.y + lVar4) / 2;
              }
              pPVar11 = pPVar11 + -1;
              pcVar13 = pcVar13 + -1;
              lVar3 = local_a8.x;
              lVar4 = local_a8.y;
            }
            local_a8.y = lVar4;
            local_a8.x = lVar3;
            PVar1 = outline->contours_flag[lVar8];
            stroker->first_point = '\x01';
            local_58->x = local_a8.x;
            local_58->y = local_a8.y;
            stroker->subpath_open = PVar1;
            bVar15 = true;
            if (stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND) {
              if (PVar1 == '\0') {
                bVar15 = false;
              }
              else {
                bVar15 = stroker->line_cap == PVG_FT_STROKER_LINECAP_BUTT;
              }
            }
            stroker->handle_wide_strokes = bVar15;
            local_60->x = local_a8.x;
            local_60->y = local_a8.y;
            stroker->angle_in = 0;
            do {
              while( true ) {
                while( true ) {
                  if (pPVar10 <= pPVar11) goto LAB_0011eb51;
                  pPVar9 = pPVar11 + 1;
                  pcVar14 = pcVar13 + 1;
                  if ((pcVar13[1] & 3U) != 0) break;
                  local_88.x = pPVar11[1].x;
                  local_88.y = pPVar11[1].y;
                  do {
                    if (pPVar10 <= pPVar9) {
                      PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_a8);
                      goto LAB_0011eb51;
                    }
                    local_b8.x = pPVar9[1].x;
                    local_b8.y = pPVar9[1].y;
                    if ((pcVar14[1] & 3U) == 0) {
                      local_78.x = (local_b8.x + local_88.x) / 2;
                      local_78.y = (local_b8.y + local_88.y) / 2;
                      PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_78);
                      local_88.x = local_b8.x;
                      local_88.y = local_b8.y;
                      iVar7 = 10;
                    }
                    else {
                      iVar7 = 5;
                      if ((pcVar14[1] & 3U) == 1) {
                        PVG_FT_Stroker_ConicTo(stroker,&local_88,&local_b8);
                        iVar7 = 7;
                      }
                    }
                    pPVar9 = pPVar9 + 1;
                    pcVar14 = pcVar14 + 1;
                  } while (iVar7 == 10);
                  outline = local_90;
                  pPVar11 = pPVar9;
                  pcVar13 = pcVar14;
                  if (iVar7 != 7) goto LAB_0011eb97;
                }
                if ((pcVar13[1] & 3U) != 1) break;
                local_b8.x = pPVar11[1].x;
                local_b8.y = pPVar11[1].y;
                PVG_FT_Stroker_LineTo(stroker,&local_b8);
                pPVar11 = pPVar9;
                pcVar13 = pcVar14;
              }
              iVar7 = 5;
              if ((pPVar11 + 2 <= pPVar10) && ((pcVar13[2] & 3U) == 2)) {
                pPVar12 = pPVar11 + 3;
                pcVar14 = pcVar13 + 3;
                local_b8.x = pPVar9->x;
                local_b8.y = pPVar11[1].y;
                local_78.x = pPVar11[2].x;
                local_78.y = pPVar11[2].y;
                pPVar9 = pPVar12;
                if (pPVar10 < pPVar12) {
                  PVG_FT_Stroker_CubicTo(stroker,&local_b8,&local_78,&local_a8);
                  iVar7 = 0xb;
                }
                else {
                  local_48.x = pPVar12->x;
                  local_48.y = pPVar11[3].y;
                  PVG_FT_Stroker_CubicTo(stroker,&local_b8,&local_78,&local_48);
                  iVar7 = 7;
                }
              }
              pPVar11 = pPVar9;
              pcVar13 = pcVar14;
            } while (iVar7 == 7);
            outline = local_90;
            if (iVar7 == 0xb) {
LAB_0011eb51:
              if (stroker->first_point != '\0') {
                stroker->subpath_open = '\x01';
                ft_stroker_subpath_start(stroker,0,0);
              }
              PVG_FT_Stroker_EndSubPath(stroker);
              uVar6 = (int)local_50 + 1;
              iVar7 = 0;
              outline = local_90;
            }
          }
        }
        else {
          uVar6 = uVar2 + 1;
          iVar7 = 4;
        }
LAB_0011eb97:
        PVar5 = 0;
        if ((iVar7 != 0) && (iVar7 != 4)) {
          if (iVar7 != 5) {
            return 0;
          }
          return -2;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < outline->n_contours);
    }
  }
  return PVar5;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ParseOutline(PVG_FT_Stroker        stroker,
                                       const PVG_FT_Outline* outline)
{
    PVG_FT_Vector v_last;
    PVG_FT_Vector v_control;
    PVG_FT_Vector v_start;

    PVG_FT_Vector* point;
    PVG_FT_Vector* limit;
    char*         tags;

    PVG_FT_Error error;

    PVG_FT_Int  n;     /* index of contour in outline     */
    PVG_FT_UInt first; /* index of first point in contour */
    PVG_FT_Int  tag;   /* current point's state           */

    if (!outline || !stroker) return -1;  // PVG_FT_THROW( Invalid_Argument );

    PVG_FT_Stroker_Rewind(stroker);

    first = 0;

    for (n = 0; n < outline->n_contours; n++) {
        PVG_FT_UInt last; /* index of last point in contour */

        last = outline->contours[n];
        limit = outline->points + last;

        /* skip empty points; we don't stroke these */
        if (last <= first) {
            first = last + 1;
            continue;
        }

        v_start = outline->points[first];
        v_last = outline->points[last];

        v_control = v_start;

        point = outline->points + first;
        tags = outline->tags + first;
        tag = PVG_FT_CURVE_TAG(tags[0]);

        /* A contour cannot start with a cubic control point! */
        if (tag == PVG_FT_CURVE_TAG_CUBIC) goto Invalid_Outline;

        /* check first point to determine origin */
        if (tag == PVG_FT_CURVE_TAG_CONIC) {
            /* First point is conic control.  Yes, this happens. */
            if (PVG_FT_CURVE_TAG(outline->tags[last]) == PVG_FT_CURVE_TAG_ON) {
                /* start at last point if it is on the curve */
                v_start = v_last;
                limit--;
            } else {
                /* if both first and last points are conic, */
                /* start at their middle                    */
                v_start.x = (v_start.x + v_last.x) / 2;
                v_start.y = (v_start.y + v_last.y) / 2;
            }
            point--;
            tags--;
        }

        error = PVG_FT_Stroker_BeginSubPath(stroker, &v_start, outline->contours_flag[n]);
        if (error) goto Exit;

        while (point < limit) {
            point++;
            tags++;

            tag = PVG_FT_CURVE_TAG(tags[0]);
            switch (tag) {
            case PVG_FT_CURVE_TAG_ON: /* emit a single line_to */
            {
                PVG_FT_Vector vec;

                vec.x = point->x;
                vec.y = point->y;

                error = PVG_FT_Stroker_LineTo(stroker, &vec);
                if (error) goto Exit;
                continue;
            }

            case PVG_FT_CURVE_TAG_CONIC: /* consume conic arcs */
                v_control.x = point->x;
                v_control.y = point->y;

            Do_Conic:
                if (point < limit) {
                    PVG_FT_Vector vec;
                    PVG_FT_Vector v_middle;

                    point++;
                    tags++;
                    tag = PVG_FT_CURVE_TAG(tags[0]);

                    vec = point[0];

                    if (tag == PVG_FT_CURVE_TAG_ON) {
                        error =
                            PVG_FT_Stroker_ConicTo(stroker, &v_control, &vec);
                        if (error) goto Exit;
                        continue;
                    }

                    if (tag != PVG_FT_CURVE_TAG_CONIC) goto Invalid_Outline;

                    v_middle.x = (v_control.x + vec.x) / 2;
                    v_middle.y = (v_control.y + vec.y) / 2;

                    error =
                        PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_middle);
                    if (error) goto Exit;

                    v_control = vec;
                    goto Do_Conic;
                }

                error = PVG_FT_Stroker_ConicTo(stroker, &v_control, &v_start);
                goto Close;

            default: /* PVG_FT_CURVE_TAG_CUBIC */
            {
                PVG_FT_Vector vec1, vec2;

                if (point + 1 > limit ||
                    PVG_FT_CURVE_TAG(tags[1]) != PVG_FT_CURVE_TAG_CUBIC)
                    goto Invalid_Outline;

                point += 2;
                tags += 2;

                vec1 = point[-2];
                vec2 = point[-1];

                if (point <= limit) {
                    PVG_FT_Vector vec;

                    vec = point[0];

                    error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &vec);
                    if (error) goto Exit;
                    continue;
                }

                error = PVG_FT_Stroker_CubicTo(stroker, &vec1, &vec2, &v_start);
                goto Close;
            }
            }
        }

    Close:
        if (error) goto Exit;

        if (stroker->first_point) {
            stroker->subpath_open = TRUE;
            error = ft_stroker_subpath_start(stroker, 0, 0);
            if (error) goto Exit;
        }

        error = PVG_FT_Stroker_EndSubPath(stroker);
        if (error) goto Exit;

        first = last + 1;
    }

    return 0;

Exit:
    return error;

Invalid_Outline:
    return -2;  // PVG_FT_THROW( Invalid_Outline );
}